

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall ChainstateManager::LoadBlockIndex(ChainstateManager *this)

{
  BlockManager *this_00;
  CBlockIndex *pindex;
  long lVar1;
  pointer ppCVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  CBlockIndex *pCVar9;
  pointer ppCVar10;
  undefined8 uVar11;
  long in_FS_OFFSET;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vSortedByHeight;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_78;
  _Storage<uint256,_true> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) == 0) {
LAB_00ae7853:
    bVar4 = true;
  }
  else {
    this_00 = &this->m_blockman;
    SnapshotBlockhash((optional<uint256> *)&local_60._M_value,this);
    bVar4 = ::node::BlockManager::LoadBlockIndexDB(this_00,(optional<uint256> *)&local_60._M_value);
    if (bVar4) {
      ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
      ::node::BlockManager::GetAllBlockIndices
                ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&local_60._M_value,this_00
                );
      uVar3 = local_60._8_8_;
      uVar11 = local_60._0_8_;
      bVar4 = true;
      if (local_60._0_8_ != local_60._8_8_) {
        uVar8 = (long)(local_60._8_8_ - local_60._0_8_) >> 3;
        lVar1 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                  (local_60._0_8_,local_60._8_8_,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                  (uVar11,uVar3);
        uVar11 = local_60._0_8_;
        if (local_60._0_8_ != local_60._8_8_) {
          do {
            pindex = *(CBlockIndex **)uVar11;
            bVar4 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
            if (bVar4) break;
            if (this->m_active_chainstate == (Chainstate *)0x0) {
              pCVar9 = (CBlockIndex *)0x0;
            }
            else {
              pCVar9 = Chainstate::SnapshotBase(this->m_active_chainstate);
            }
            if (pindex == pCVar9) {
LAB_00ae7765:
              GetAll(&local_78,this);
              ppCVar2 = local_78.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              for (ppCVar10 = local_78.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start; ppCVar10 != ppCVar2;
                  ppCVar10 = ppCVar10 + 1) {
                Chainstate::TryAddBlockIndexCandidate(*ppCVar10,pindex);
              }
              if (local_78.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.
                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_78.
                                      super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_78.
                                      super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar6 = pindex->nStatus & 0x60;
LAB_00ae77b8:
              if ((uVar6 != 0) &&
                 ((this->m_best_invalid == (CBlockIndex *)0x0 ||
                  (iVar7 = base_uint<256U>::CompareTo
                                     (&(pindex->nChainWork).super_base_uint<256U>,
                                      &(this->m_best_invalid->nChainWork).super_base_uint<256U>),
                  0 < iVar7)))) {
                this->m_best_invalid = pindex;
              }
            }
            else {
              uVar6 = pindex->nStatus & 0x60;
              if ((pindex->nStatus & 7) < 3 || uVar6 != 0) goto LAB_00ae77b8;
              if ((pindex->m_chain_tx_count != 0) || (pindex->pprev == (CBlockIndex *)0x0))
              goto LAB_00ae7765;
            }
            if (((pindex->nStatus & 6) != 0 && (pindex->nStatus & 0x60) == 0) &&
               ((this->m_best_header == (CBlockIndex *)0x0 ||
                (bVar5 = ::node::CBlockIndexWorkComparator::operator()
                                   ((CBlockIndexWorkComparator *)&local_78,this->m_best_header,
                                    pindex), bVar5)))) {
              this->m_best_header = pindex;
            }
            uVar11 = uVar11 + 8;
          } while (uVar11 != local_60._8_8_);
          bVar4 = !bVar4;
        }
      }
      if ((undefined8 *)local_60._0_8_ != (undefined8 *)0x0) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
      }
      if (bVar4) goto LAB_00ae7853;
    }
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::LoadBlockIndex()
{
    AssertLockHeld(cs_main);
    // Load block index from databases
    if (m_blockman.m_blockfiles_indexed) {
        bool ret{m_blockman.LoadBlockIndexDB(SnapshotBlockhash())};
        if (!ret) return false;

        m_blockman.ScanAndUnlinkAlreadyPrunedFiles();

        std::vector<CBlockIndex*> vSortedByHeight{m_blockman.GetAllBlockIndices()};
        std::sort(vSortedByHeight.begin(), vSortedByHeight.end(),
                  CBlockIndexHeightOnlyComparator());

        for (CBlockIndex* pindex : vSortedByHeight) {
            if (m_interrupt) return false;
            // If we have an assumeutxo-based chainstate, then the snapshot
            // block will be a candidate for the tip, but it may not be
            // VALID_TRANSACTIONS (eg if we haven't yet downloaded the block),
            // so we special-case the snapshot block as a potential candidate
            // here.
            if (pindex == GetSnapshotBaseBlock() ||
                    (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) &&
                     (pindex->HaveNumChainTxs() || pindex->pprev == nullptr))) {

                for (Chainstate* chainstate : GetAll()) {
                    chainstate->TryAddBlockIndexCandidate(pindex);
                }
            }
            if (pindex->nStatus & BLOCK_FAILED_MASK && (!m_best_invalid || pindex->nChainWork > m_best_invalid->nChainWork)) {
                m_best_invalid = pindex;
            }
            if (pindex->IsValid(BLOCK_VALID_TREE) && (m_best_header == nullptr || CBlockIndexWorkComparator()(m_best_header, pindex)))
                m_best_header = pindex;
        }
    }
    return true;
}